

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  ctrl_t *pcVar1;
  size_t size;
  slot_type *__n;
  uint uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  char cVar27;
  ushort uVar28;
  int iVar29;
  Rep *pRVar30;
  size_t *psVar31;
  MixingHashState MVar32;
  long lVar33;
  anon_union_8_1_a8a14541_for_iterator_2 aVar34;
  reference ppVar35;
  anon_union_8_1_a8a14541_for_iterator_2 aVar36;
  anon_union_8_1_a8a14541_for_iterator_2 aVar37;
  uint uVar38;
  uint64_t v;
  ulong uVar39;
  undefined8 uVar40;
  undefined1 uVar41;
  undefined3 in_register_00000089;
  ulong uVar42;
  uint64_t v_1;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar43;
  long *plVar44;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  string_view input;
  FindInfo FVar52;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
  it_inserted;
  JsonNameDetails details;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  anon_class_24_3_4f82d86e make_error;
  __m128i match;
  __m128i match_1;
  anon_union_8_1_a8a14541_for_iterator_2 local_1e0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1d8;
  undefined1 local_1d0 [64];
  undefined1 local_190 [8];
  undefined1 local_188 [64];
  undefined1 local_148 [16];
  HeapOrSoo local_138;
  anon_union_8_1_a8a14541_for_iterator_2 local_128;
  anon_union_8_1_a8a14541_for_iterator_2 local_120;
  DescriptorBuilder *local_118;
  size_t local_110;
  char *local_108;
  anon_union_8_1_a8a14541_for_iterator_2 local_100;
  JsonNameDetails *local_f8;
  anon_union_8_1_a8a14541_for_iterator_2 local_f0;
  undefined1 local_e8 [16];
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  ctrl_t cStack_b0;
  ctrl_t cStack_af;
  ctrl_t cStack_ae;
  ctrl_t cStack_ad;
  ctrl_t cStack_ac;
  ctrl_t cStack_ab;
  ctrl_t cStack_aa;
  ctrl_t cStack_a9;
  Descriptor *local_a0;
  void **local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  VoidPtr local_70;
  code *pcStack_68;
  VoidPtr local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  anon_union_8_1_a8a14541_for_iterator_2 local_40;
  anon_union_8_1_a8a14541_for_iterator_2 local_38;
  
  local_188._60_4_ = CONCAT31(in_register_00000089,use_custom_names);
  local_108 = message_name._M_str;
  local_110 = message_name._M_len;
  local_148 = (undefined1  [16])0x0;
  local_1d0._48_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  local_138.heap.control =
       (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  pRVar45 = &(message->field_0)._impl_.field_;
  aVar37 = (anon_union_8_1_a8a14541_for_iterator_2)message;
  pRVar43 = pRVar45;
  local_118 = this;
  local_a0 = descriptor;
  if ((undefined1  [216])((undefined1  [216])message->field_0 & (undefined1  [216])0x1) !=
      (undefined1  [216])0x0) {
    pRVar30 = internal::RepeatedPtrFieldBase::rep(&pRVar45->super_RepeatedPtrFieldBase);
    pRVar43 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar30->elements;
  }
  if (((ulong)(pRVar45->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar30 = internal::RepeatedPtrFieldBase::rep(&pRVar45->super_RepeatedPtrFieldBase);
    pRVar45 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar30->elements;
  }
  local_98 = &(pRVar45->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
             *(int *)((long)&message->field_0 + 0x10);
  if (pRVar43 != (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_98) {
    do {
      local_1d0._24_8_ = (pRVar43->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      psVar31 = (size_t *)(*(ulong *)(local_1d0._24_8_ + 0x18) & 0xfffffffffffffffc);
      input._M_str = (char *)aVar37.slot_;
      input._M_len = *psVar31;
      local_188._48_8_ = pRVar43;
      (anonymous_namespace)::ToJsonName_abi_cxx11_
                ((string *)&local_1e0,(_anonymous_namespace_ *)psVar31[1],input);
      if ((local_188[0x3c] == '\0') || ((*(byte *)(local_1d0._24_8_ + 0x10) & 0x10) == 0)) {
LAB_001f0d90:
        local_190 = (undefined1  [8])local_1d0._24_8_;
        if (local_1e0.slot_ == (slot_type *)local_1d0) {
          local_188._24_8_ = local_1d0._8_8_;
          local_188._0_8_ = (slot_type *)(local_188 + 0x10);
        }
        else {
          local_188._0_8_ = local_1e0;
        }
        local_188._17_7_ = local_1d0._1_7_;
        local_188[0x10] = local_1d0[0];
        local_188._8_8_ = local_1d8;
        local_1d8.slot_ = (slot_type *)0x0;
        local_1d0[0] = '\0';
        local_188[0x20] = ~kSentinel;
        local_1e0.slot_ = (slot_type *)local_1d0;
      }
      else {
        plVar44 = (long *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_1d0._24_8_ + 0x38))->_M_allocated_capacity &
                          0xfffffffffffffffc);
        __n = (slot_type *)plVar44[1];
        if ((__n == local_1d8.slot_) &&
           ((__n == (slot_type *)0x0 ||
            (iVar29 = bcmp((void *)*plVar44,local_1e0.slot_,(size_t)__n), iVar29 == 0))))
        goto LAB_001f0d90;
        local_190 = (undefined1  [8])local_1d0._24_8_;
        local_188._0_8_ = (slot_type *)(local_188 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,*plVar44,(ctrl_t *)((long)__n + *plVar44));
        local_188[0x20] = ~kDeleted;
      }
      if (local_1e0.slot_ != (slot_type *)local_1d0) {
        operator_delete(local_1e0.slot_,CONCAT71(local_1d0._1_7_,local_1d0[0]) + 1);
      }
      uVar41 = local_188[0x20];
      if (local_188[0x20] == ~kDeleted) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_188._0_8_,(ctrl_t *)(local_188._8_8_ + local_188._0_8_)
                  );
        if ((local_88 == 0) || ((char)*local_90 != '[')) goto LAB_001f0e62;
        bVar46 = *(char *)((long)local_90 + local_88 + -1) == ']';
      }
      else {
LAB_001f0e62:
        bVar46 = false;
      }
      if ((uVar41 != ~kSentinel) && (local_90 != local_80)) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (!bVar46) {
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
        ::AssertHashEqConsistent<std::__cxx11::string>
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
        uVar25 = local_188._8_8_;
        MVar32 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                           ((MixingHashState)
                            &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                            (uchar *)local_188._0_8_,local_188._8_8_);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = (ctrl_t *)(MVar32.state_ + uVar25);
        uVar25 = local_148._0_8_;
        if ((local_148._0_8_ + 1 & local_148._0_8_) != 0) goto LAB_001f18a8;
        uVar40 = SUB168(auVar47 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar47 * ZEXT816(0x9ddfea08eb382d69),0);
        uVar39 = ((ulong)uVar40 >> 7 ^ (ulong)local_138.heap.control >> 0xc) & local_148._0_8_;
        auVar47 = ZEXT216(CONCAT11((char)uVar40,(char)uVar40) & 0x7f7f);
        auVar47 = pshuflw(auVar47,auVar47,0);
        local_e8._0_4_ = auVar47._0_4_;
        local_e8._4_4_ = local_e8._0_4_;
        local_e8._8_4_ = local_e8._0_4_;
        local_e8._12_4_ = local_e8._0_4_;
        local_1d0._56_8_ = (void *)0x0;
        local_128.slot_ = (slot_type *)local_138.heap.control;
        aVar34 = local_1d8;
        aVar36 = local_1e0;
        pRVar45 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_188._48_8_;
        uVar41 = local_1d0[0];
        do {
          uVar26 = local_138.heap.slot_array;
          local_1d0[0x20] = uVar41;
          pcVar1 = (ctrl_t *)((long)local_128.slot_ + uVar39);
          cVar5 = pcVar1[4];
          cVar6 = pcVar1[8];
          cVar7 = pcVar1[0xc];
          auVar48[0] = -(local_e8[0] == *pcVar1);
          auVar48[1] = -(local_e8[1] == pcVar1[1]);
          auVar48[2] = -(local_e8[2] == pcVar1[2]);
          auVar48[3] = -(local_e8[3] == pcVar1[3]);
          auVar48[4] = -(local_e8[4] == cVar5);
          auVar48[5] = -(local_e8[5] == pcVar1[5]);
          auVar48[6] = -(local_e8[6] == pcVar1[6]);
          auVar48[7] = -(local_e8[7] == pcVar1[7]);
          auVar48[8] = -(local_e8[8] == cVar6);
          auVar48[9] = -(local_e8[9] == pcVar1[9]);
          auVar48[10] = -(local_e8[10] == pcVar1[10]);
          auVar48[0xb] = -(local_e8[0xb] == pcVar1[0xb]);
          auVar48[0xc] = -(local_e8[0xc] == cVar7);
          auVar48[0xd] = -(local_e8[0xd] == pcVar1[0xd]);
          auVar48[0xe] = -(local_e8[0xe] == pcVar1[0xe]);
          auVar48[0xf] = -(local_e8[0xf] == pcVar1[0xf]);
          uVar28 = (ushort)(SUB161(auVar48 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar48[0xf] >> 7) << 0xf;
          uVar38 = (uint)uVar28;
          cVar8 = *pcVar1;
          cVar9 = pcVar1[1];
          cVar10 = pcVar1[2];
          cVar11 = pcVar1[3];
          cVar12 = pcVar1[5];
          cVar13 = pcVar1[6];
          cVar14 = pcVar1[7];
          cVar15 = pcVar1[9];
          cVar16 = pcVar1[10];
          cVar17 = pcVar1[0xb];
          cVar18 = pcVar1[0xd];
          cVar19 = pcVar1[0xe];
          cVar20 = pcVar1[0xf];
          aVar37 = local_128;
          uVar21 = local_c8;
          uVar22 = uStack_c4;
          uVar23 = uStack_c0;
          uVar24 = uStack_bc;
          local_c8 = *(undefined4 *)pcVar1;
          uStack_c4 = *(undefined4 *)(pcVar1 + 4);
          uStack_c0 = *(undefined4 *)(pcVar1 + 8);
          uStack_bc = *(undefined4 *)(pcVar1 + 0xc);
          while (local_1d0._16_8_ = aVar34, uVar28 != 0) {
            uVar2 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            local_d8.rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_188;
            local_d8.eq = (key_equal *)local_148;
            uVar42 = uVar2 + uVar39 & uVar25;
            lVar33 = uVar42 * 0x50;
            aVar34.slot_ = (slot_type *)(lVar33 + uVar26);
            local_f8 = (JsonNameDetails *)((long)(lVar33 + uVar26) + 0x20);
            local_1d0._40_8_ = aVar36;
            local_100.slot_ = aVar34.slot_;
            local_b8 = uVar40;
            bVar46 = absl::lts_20240722::container_internal::memory_internal::
                     DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<google::protobuf::(anonymous_namespace)::JsonNameDetails_const&>>
                               (&local_d8,
                                (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_google::protobuf::(anonymous_namespace)::JsonNameDetails_&>_>
                                 *)&local_100);
            pRVar45 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_188._48_8_;
            if (bVar46) {
              local_1d8.slot_ = (slot_type *)local_1d0._16_8_;
              local_1d0[0] = local_1d0[0x20];
              local_1e0.slot_ = (slot_type *)local_1d0._40_8_;
              if ((slot_type *)local_138.heap.control == (slot_type *)0x0) goto LAB_001f18de;
              local_1d0[0] = '\0';
              aVar36.slot_ = (slot_type *)(local_138.heap.control + uVar42);
              uVar41 = local_1d0[0];
              goto LAB_001f1200;
            }
            uVar28 = (ushort)(uVar38 - 1) & (ushort)uVar38;
            uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar28);
            aVar34 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._16_8_;
            aVar36 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._40_8_;
            uVar40 = local_b8;
            cVar8 = (ctrl_t)local_c8;
            cVar9 = local_c8._1_1_;
            cVar10 = local_c8._2_1_;
            cVar11 = local_c8._3_1_;
            cVar5 = (ctrl_t)uStack_c4;
            cVar12 = uStack_c4._1_1_;
            cVar13 = uStack_c4._2_1_;
            cVar14 = uStack_c4._3_1_;
            cVar6 = (ctrl_t)uStack_c0;
            cVar15 = uStack_c0._1_1_;
            cVar16 = uStack_c0._2_1_;
            cVar17 = uStack_c0._3_1_;
            cVar7 = (ctrl_t)uStack_bc;
            cVar18 = uStack_bc._1_1_;
            cVar19 = uStack_bc._2_1_;
            cVar20 = uStack_bc._3_1_;
            uVar21 = local_c8;
            uVar22 = uStack_c4;
            uVar23 = uStack_c0;
            uVar24 = uStack_bc;
          }
          auVar51[0] = -(cVar8 == kEmpty);
          auVar51[1] = -(cVar9 == kEmpty);
          auVar51[2] = -(cVar10 == kEmpty);
          auVar51[3] = -(cVar11 == kEmpty);
          auVar51[4] = -(cVar5 == kEmpty);
          auVar51[5] = -(cVar12 == kEmpty);
          auVar51[6] = -(cVar13 == kEmpty);
          auVar51[7] = -(cVar14 == kEmpty);
          auVar51[8] = -(cVar6 == kEmpty);
          auVar51[9] = -(cVar15 == kEmpty);
          auVar51[10] = -(cVar16 == kEmpty);
          auVar51[0xb] = -(cVar17 == kEmpty);
          auVar51[0xc] = -(cVar7 == kEmpty);
          auVar51[0xd] = -(cVar18 == kEmpty);
          auVar51[0xe] = -(cVar19 == kEmpty);
          auVar51[0xf] = -(cVar20 == kEmpty);
          uVar28 = (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar51[0xf] >> 7) << 0xf;
          local_c8 = uVar21;
          uStack_c4 = uVar22;
          uStack_c0 = uVar23;
          uStack_bc = uVar24;
          if (uVar28 == 0) {
            if ((ulong)local_148._0_8_ < (void *)(local_1d0._56_8_ + 0x10)) {
              local_1d0[0] = local_1d0[0x20];
              local_1e0 = aVar36;
              local_1d8 = aVar34;
              __assert_fail("seq.index() <= capacity() && \"full table!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xef5,
                            "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                           );
            }
            uVar39 = local_1d0._56_8_ + uVar39 + 0x10 & uVar25;
            uVar41 = local_1d0[0x20];
            local_1d0._56_8_ = (void *)(local_1d0._56_8_ + 0x10);
          }
          else {
            cVar27 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                               (local_148._0_8_,uVar40,local_138.heap.control);
            if (cVar27 == '\0') {
              uVar38 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
            }
            else {
              uVar3 = 0xf;
              if (uVar28 != 0) {
                for (; uVar28 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              uVar38 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
            }
            FVar52.offset = uVar38 + uVar39 & uVar25;
            FVar52.probe_length = local_1d0._56_8_;
            lVar33 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                               ((CommonFields *)local_148,uVar40,FVar52,
                                (PolicyFunctions *)
                                absl::lts_20240722::container_internal::
                                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                                ::GetPolicyFunctions()::value);
            if ((slot_type *)local_138.heap.control == (slot_type *)0x0) {
              local_1d8.slot_ = (slot_type *)local_1d0._16_8_;
              local_1d0[0] = local_1d0[0x20];
              local_1e0 = aVar36;
LAB_001f18de:
              __assert_fail("ctrl != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x9c4,
                            "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                           );
            }
            aVar36.slot_ = (slot_type *)(local_138.heap.control + lVar33);
            aVar34.slot_ = (slot_type *)(lVar33 * 0x50 + (long)local_138.heap.slot_array);
            uVar41 = '\x01';
          }
          aVar37 = local_128;
        } while (uVar28 == 0);
LAB_001f1200:
        local_1d0[0] = uVar41;
        local_1d8 = aVar34;
        local_1e0 = aVar36;
        if (local_1d0[0] == '\x01') {
          local_188._40_8_ = local_1e0;
          local_40.slot_ = (slot_type *)local_1e0;
          local_38.slot_ = (slot_type *)local_1d8;
          *(anon_union_216_1_493b367e_for_DescriptorProto_4 **)local_1d8.slot_ =
               (anon_union_216_1_493b367e_for_DescriptorProto_4 *)((long)local_1d8.slot_ + 0x10);
          local_120.slot_ = (slot_type *)local_1d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8.slot_,local_188._0_8_,
                     (ctrl_t *)(local_188._8_8_ + local_188._0_8_));
          aVar37 = local_120;
          ((JsonNameDetails *)((long)local_120.slot_ + 0x20))->field =
               (FieldDescriptorProto *)local_190;
          (((string *)((long)aVar37.slot_ + 0x28))->_M_dataplus)._M_p =
               (pointer)((long)aVar37.slot_ + 0x38);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)aVar37.slot_ + 0x28),local_188._0_8_,
                     (ctrl_t *)(local_188._8_8_ + local_188._0_8_));
          *(undefined1 *)((long)aVar37.slot_ + 0x48) = local_188[0x20];
          ppVar35 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                    ::iterator::operator*((iterator *)&local_40);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
          ::AssertHashEqConsistent<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                      *)local_148,&ppVar35->first);
          size = (ppVar35->first)._M_string_length;
          MVar32 = absl::lts_20240722::hash_internal::MixingHashState::combine_contiguous
                             ((MixingHashState)
                              &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                              (uchar *)(ppVar35->first)._M_dataplus._M_p,size);
          uVar25 = local_148._0_8_;
          if (((ulong)(local_148._0_8_ + 1) & local_148._0_8_) != 0) goto LAB_001f18a8;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = MVar32.state_ + size;
          uVar39 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
          aVar37.slot_ = (slot_type *)
                         ((uVar39 >> 7 ^ (ulong)local_138.heap.control >> 0xc) & local_148._0_8_);
          uVar41 = (undefined1)uVar39;
          auVar47 = ZEXT416((CONCAT11(uVar41,uVar41) & 0xff7f) & 0xffff7fff);
          auVar47 = pshuflw(auVar47,auVar47,0);
          local_c8 = auVar47._0_4_;
          local_1d0._56_8_ = local_138.heap.slot_array;
          aVar34.slot_ = (slot_type *)0x0;
          local_1d0._32_8_ = local_138.heap.control;
          local_1d0._16_8_ = aVar37.slot_;
          uStack_c4 = local_c8;
          uStack_c0 = local_c8;
          uStack_bc = local_c8;
          do {
            pcVar1 = (ctrl_t *)((long)(slot_type *)local_1d0._32_8_ + local_1d0._16_8_);
            local_b8 = *(undefined8 *)pcVar1;
            cStack_b0 = pcVar1[8];
            cStack_af = pcVar1[9];
            cStack_ae = pcVar1[10];
            cStack_ad = pcVar1[0xb];
            cStack_ac = pcVar1[0xc];
            cStack_ab = pcVar1[0xd];
            cStack_aa = pcVar1[0xe];
            cStack_a9 = pcVar1[0xf];
            auVar49[0] = -((ctrl_t)local_c8 == *pcVar1);
            auVar49[1] = -(local_c8._1_1_ == pcVar1[1]);
            auVar49[2] = -(local_c8._2_1_ == pcVar1[2]);
            auVar49[3] = -(local_c8._3_1_ == pcVar1[3]);
            auVar49[4] = -((ctrl_t)uStack_c4 == pcVar1[4]);
            auVar49[5] = -(uStack_c4._1_1_ == pcVar1[5]);
            auVar49[6] = -(uStack_c4._2_1_ == pcVar1[6]);
            auVar49[7] = -(uStack_c4._3_1_ == pcVar1[7]);
            auVar49[8] = -((ctrl_t)uStack_c0 == cStack_b0);
            auVar49[9] = -(uStack_c0._1_1_ == cStack_af);
            auVar49[10] = -(uStack_c0._2_1_ == cStack_ae);
            auVar49[0xb] = -(uStack_c0._3_1_ == cStack_ad);
            auVar49[0xc] = -((ctrl_t)uStack_bc == cStack_ac);
            auVar49[0xd] = -(uStack_bc._1_1_ == cStack_ab);
            auVar49[0xe] = -(uStack_bc._2_1_ == cStack_aa);
            auVar49[0xf] = -(uStack_bc._3_1_ == cStack_a9);
            uVar28 = (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar49[0xf] >> 7) << 0xf;
            uVar38 = (uint)uVar28;
            local_128 = aVar34;
            while (uVar28 != 0) {
              uVar2 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                }
              }
              local_d8.eq = (key_equal *)local_148;
              uVar39 = (ulong)((ulong)uVar2 + local_1d0._16_8_) & uVar25;
              lVar33 = uVar39 * 0x50;
              aVar37.slot_ = (slot_type *)(local_1d0._56_8_ + lVar33);
              local_f8 = (JsonNameDetails *)(local_1d0._56_8_ + lVar33 + 0x20);
              local_100.slot_ = aVar37.slot_;
              local_d8.rhs = &ppVar35->first;
              bVar46 = absl::lts_20240722::container_internal::memory_internal::
                       DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<google::protobuf::(anonymous_namespace)::JsonNameDetails_const&>>
                                 (&local_d8,
                                  (pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_google::protobuf::(anonymous_namespace)::JsonNameDetails_&>_>
                                   *)&local_100);
              if (bVar46) {
                if ((slot_type *)local_1d0._32_8_ == (slot_type *)0x0) goto LAB_001f18de;
                local_1d0._40_8_ = (long)(slot_type *)local_1d0._32_8_ + uVar39;
                local_e8._0_8_ = aVar37.slot_;
              }
              aVar37 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._32_8_;
              if (bVar46) break;
              uVar28 = (ushort)(uVar38 - 1) & (ushort)uVar38;
              uVar38 = CONCAT22((short)(uVar38 - 1 >> 0x10),uVar28);
            }
            aVar34 = local_128;
            if (uVar28 != 0) {
              bVar46 = false;
            }
            else {
              auVar50[0] = -((char)local_b8 == -0x80);
              auVar50[1] = -(local_b8._1_1_ == -0x80);
              auVar50[2] = -(local_b8._2_1_ == -0x80);
              auVar50[3] = -(local_b8._3_1_ == -0x80);
              auVar50[4] = -(local_b8._4_1_ == -0x80);
              auVar50[5] = -(local_b8._5_1_ == -0x80);
              auVar50[6] = -(local_b8._6_1_ == -0x80);
              auVar50[7] = -(local_b8._7_1_ == -0x80);
              auVar50[8] = -(cStack_b0 == kEmpty);
              auVar50[9] = -(cStack_af == kEmpty);
              auVar50[10] = -(cStack_ae == kEmpty);
              auVar50[0xb] = -(cStack_ad == kEmpty);
              auVar50[0xc] = -(cStack_ac == kEmpty);
              auVar50[0xd] = -(cStack_ab == kEmpty);
              auVar50[0xe] = -(cStack_aa == kEmpty);
              auVar50[0xf] = -(cStack_a9 == kEmpty);
              if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar50 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) {
                aVar37.slot_ = (slot_type *)((long)local_128.slot_ + 0x10);
                if ((ulong)uVar25 < aVar37.slot_) {
                  __assert_fail("seq.index() <= capacity() && \"full table!\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0xdbd,
                                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                               );
                }
                local_1d0._16_8_ =
                     (ulong)((ctrl_t *)(local_1d0._16_8_ + (long)local_128.slot_) + 0x10) & uVar25;
                bVar46 = true;
                aVar34.slot_ = aVar37.slot_;
              }
              else {
                local_1d0._40_8_ = (pointer)0x0;
                bVar46 = false;
              }
            }
          } while (bVar46);
          if ((local_1d0._40_8_ != local_1d0._48_8_ && (pointer)local_1d0._40_8_ != (pointer)0x0) &&
             (*(ctrl_t *)local_1d0._40_8_ < ~kSentinel)) goto LAB_001f186e;
          aVar37._0_1_ = local_188._40_8_ == local_1d0._48_8_ ||
                         (slot_type *)local_188._40_8_ == (slot_type *)0x0;
          if ((local_188._40_8_ != local_1d0._48_8_ &&
               (slot_type *)local_188._40_8_ != (slot_type *)0x0) &&
             (*(ctrl_t *)local_188._40_8_ < ~kSentinel)) goto LAB_001f1873;
          if ((local_188._40_8_ == local_1d0._48_8_) && (local_1d0._40_8_ == local_1d0._48_8_)) {
LAB_001f163c:
            pRVar45 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_188._48_8_;
            if (local_1d0._40_8_ != local_188._40_8_) {
              __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf3f,
                            "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                           );
            }
            goto LAB_001f178c;
          }
          aVar37._1_7_ = SUB87(local_1d0._48_8_,1);
          aVar37._0_1_ = local_1d0._40_8_ == local_1d0._48_8_;
          if ((local_188._40_8_ == local_1d0._48_8_) != (local_1d0._40_8_ == local_1d0._48_8_))
          goto LAB_001f1878;
          if (((slot_type *)local_188._40_8_ == (slot_type *)0x0) ||
             ((pointer)local_1d0._40_8_ == (pointer)0x0)) goto LAB_001f163c;
          aVar37._0_1_ = ((slot_type *)local_188._40_8_ ==
                         (slot_type *)&absl::lts_20240722::container_internal::kSooControl) !=
                         ((undefined8 *)local_1d0._40_8_ ==
                         &absl::lts_20240722::container_internal::kSooControl);
          aVar37._1_7_ = 0x4e00;
          if (!(bool)aVar37._0_1_) {
            if ((undefined8 *)local_1d0._40_8_ ==
                &absl::lts_20240722::container_internal::kSooControl) {
              bVar46 = (slot_type *)local_e8._0_8_ == local_120.slot_;
            }
            else {
              aVar36 = local_120;
              aVar37 = (anon_union_8_1_a8a14541_for_iterator_2)local_e8._0_8_;
              aVar34 = (anon_union_8_1_a8a14541_for_iterator_2)local_188._40_8_;
              if ((ulong)local_188._40_8_ < (ulong)local_1d0._40_8_) {
                aVar36 = (anon_union_8_1_a8a14541_for_iterator_2)local_e8._0_8_;
                aVar37 = local_120;
                aVar34 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._40_8_;
              }
              bVar46 = aVar37.slot_ <= aVar36.slot_ && aVar34.slot_ < aVar37.slot_;
            }
            if (bVar46) goto LAB_001f163c;
          }
        }
        else {
          if (local_1e0.slot_ == (slot_type *)0x0) {
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"raw_hash_set.h",0x624,"%s called on end() iterator.","operator->");
            CheckFieldJsonNameUniqueness();
LAB_001f1818:
            absl::lts_20240722::raw_log_internal::RawLog
                      (kFatal,"raw_hash_set.h",0x628,"%s called on default-constructed iterator.",
                       "operator->");
            CheckFieldJsonNameUniqueness();
          }
          else {
            if (local_1e0.slot_ == (slot_type *)local_1d0._48_8_) goto LAB_001f1818;
            if (kSentinel < *(ctrl_t *)local_1e0.slot_) {
              ppVar35 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                        ::iterator::operator*((iterator *)&local_1e0);
              if (((local_188[0x3c] == '\0') || (local_188[0x20] != ~kSentinel)) ||
                 ((ppVar35->second).is_custom != false)) {
                local_f8 = &ppVar35->second;
                local_100.slot_ = (slot_type *)local_190;
                local_f0.slot_ = (slot_type *)local_1d0._24_8_;
                aVar37 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._24_8_;
                if (((local_a0->merged_features_->field_0)._impl_.json_format_ == 2) &&
                   (((ppVar35->second).is_custom & local_188[0x20]) == ~kSentinel)) {
                  pcStack_58 = absl::lts_20240722::functional_internal::
                               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  local_60.obj = &local_100;
                  element_name_00._M_str = local_108;
                  element_name_00._M_len = local_110;
                  make_error_01.invoker_ =
                       absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  make_error_01.ptr_.obj = local_60.obj;
                  AddWarning(local_118,element_name_00,(Message *)local_1d0._24_8_,NAME,
                             make_error_01);
                }
                else {
                  pcStack_68 = absl::lts_20240722::functional_internal::
                               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  local_70.obj = &local_100;
                  element_name_01._M_str = local_108;
                  element_name_01._M_len = local_110;
                  make_error_02.invoker_ =
                       absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
                  ;
                  make_error_02.ptr_.obj = local_70.obj;
                  AddError(local_118,element_name_01,(Message *)local_1d0._24_8_,NAME,make_error_02)
                  ;
                }
              }
              goto LAB_001f178c;
            }
          }
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"raw_hash_set.h",0x63e,
                     "%s called on invalid iterator. The element might have been erased or the table might have rehashed. Consider running with --config=asan to diagnose rehashing issues."
                     ,"operator->");
          CheckFieldJsonNameUniqueness();
LAB_001f186e:
          CheckFieldJsonNameUniqueness();
LAB_001f1873:
          CheckFieldJsonNameUniqueness();
LAB_001f1878:
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"raw_hash_set.h",0x687,"Invalid iterator comparison. %s",
                     "Comparing default-constructed hashtable iterator with a non-default-constructed hashtable iterator."
                    );
          CheckFieldJsonNameUniqueness();
        }
        CheckFieldJsonNameUniqueness();
LAB_001f18a8:
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x145,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      local_1e0.slot_ = (slot_type *)local_1d0._24_8_;
      local_1d8.slot_ = (slot_type *)local_190;
      pcStack_48 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      local_50.obj = &local_1e0;
      element_name._M_str = local_108;
      element_name._M_len = local_110;
      make_error_00.invoker_ =
           absl::lts_20240722::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_50.obj;
      aVar37 = (anon_union_8_1_a8a14541_for_iterator_2)local_1d0._24_8_;
      AddError(local_118,element_name,(Message *)local_1d0._24_8_,NAME,make_error_00);
      pRVar45 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_188._48_8_;
LAB_001f178c:
      if ((slot_type *)local_188._0_8_ != (slot_type *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
      }
      pRVar43 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                &(pRVar45->super_RepeatedPtrFieldBase).current_size_;
    } while (pRVar43 != (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)local_98);
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                   *)local_148);
  return;
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}